

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O1

JL_STATUS JlGetListFromDictionaryByKey
                    (JlDataObject *DictionaryObject,char *KeyName,JlDataObject **pListObject)

{
  JL_STATUS JVar1;
  JlDataObject *object;
  JlDataObject *local_10;
  
  JVar1 = JL_STATUS_INVALID_PARAMETER;
  if (pListObject != (JlDataObject **)0x0 &&
      (KeyName != (char *)0x0 && DictionaryObject != (JlDataObject *)0x0)) {
    *pListObject = (JlDataObject *)0x0;
    local_10 = (JlDataObject *)0x0;
    JVar1 = JlGetObjectFromDictionaryByKey(DictionaryObject,KeyName,&local_10);
    if (JVar1 == JL_STATUS_SUCCESS) {
      JVar1 = JL_STATUS_WRONG_TYPE;
      if (local_10->Type == JL_DATA_TYPE_LIST) {
        *pListObject = local_10;
        JVar1 = JL_STATUS_SUCCESS;
      }
    }
  }
  return JVar1;
}

Assistant:

JL_STATUS
    JlGetListFromDictionaryByKey
    (
        JlDataObject const*         DictionaryObject,
        char const*                 KeyName,
        JlDataObject**              pListObject
    )
{
    JL_STATUS jlStatus;

    if(     NULL != DictionaryObject
        &&  NULL != KeyName
        &&  NULL != pListObject )
    {
        *pListObject = NULL;

        JlDataObject* object = NULL;
        jlStatus = JlGetObjectFromDictionaryByKey( DictionaryObject, KeyName, &object );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            if( JL_DATA_TYPE_LIST == object->Type )
            {
                *pListObject = object;
            }
            else
            {
                jlStatus = JL_STATUS_WRONG_TYPE;
            }
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}